

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ByteCodeEmitter.cpp
# Opt level: O3

void SetNewArrayElements(ParseNode *pnode,RegSlot arrayLocation,ByteCodeGenerator *byteCodeGenerator
                        ,FuncInfo *funcInfo)

{
  ByteCodeWriter *this;
  uint argCount;
  ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *this_00;
  code *pcVar1;
  bool bVar2;
  BOOL BVar3;
  RegSlot RVar4;
  ParseNodeUni *pPVar5;
  ParseNodeArrLit *pPVar6;
  undefined4 *puVar7;
  AuxArray<int> *obj;
  AuxArray<double> *obj_00;
  AuxArray<void_*> *obj_01;
  ParseNodeBin *pPVar8;
  ulong uVar9;
  size_t sVar10;
  char *pcVar11;
  int iVar12;
  int byteCount;
  ParseNode *args;
  undefined4 uVar13;
  undefined7 uVar14;
  RegSlot RVar15;
  uint uVar16;
  ulong uVar17;
  bool bVar18;
  uint local_6c;
  AuxArray<unsigned_int> *local_68;
  int32 local_44;
  undefined4 local_40;
  int auxSize;
  RegSlot local_38;
  int extraAlloc;
  
  pPVar5 = ParseNode::AsParseNodeUni(pnode);
  args = pPVar5->pnode1;
  pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
  argCount = pPVar6->count;
  pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
  uVar16 = pPVar6->spreadCount;
  bVar2 = CreateNativeArrays(byteCodeGenerator,funcInfo);
  if (bVar2) {
    pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
    if ((pPVar6->field_0x20 & 2) != 0) {
      auxSize = 0;
      local_44 = 0;
      bVar2 = Int32Math::Mul(argCount,4,&auxSize);
      if ((bVar2) || (bVar2 = Int32Math::Add(4,auxSize,&local_44), bVar2)) goto LAB_00812df1;
      pcVar11 = (char *)byteCodeGenerator->alloc;
      uVar17 = (ulong)auxSize;
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00812df6;
        *puVar7 = 0;
      }
      sVar10 = 0xffffffffffffffff;
      if (uVar17 < 0xfffffffffffffffc) {
        sVar10 = uVar17 + 4;
      }
      obj = (AuxArray<int> *)
            Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
            AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                          pcVar11,sVar10);
      if (obj == (AuxArray<int> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar11 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
        ;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) goto LAB_00812df6;
        *puVar7 = 0;
      }
      obj->count = argCount;
      EmitConstantArgsToIntArray((ByteCodeGenerator *)pcVar11,(int32 *)(obj + 1),args,argCount);
      pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
      if ((pPVar6->field_0x20 & 8) == 0) {
LAB_00812659:
        Js::ByteCodeWriter::Auxiliary
                  (&byteCodeGenerator->m_writer,NewScIntArray,pnode->location,obj,local_44,argCount)
        ;
        Memory::
        DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<int>>
                  (byteCodeGenerator->alloc,obj,(long)auxSize);
        return;
      }
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x23a6,"(!pnode->AsParseNodeArrLit()->hasMissingValues)",
                         "!pnode->AsParseNodeArrLit()->hasMissingValues");
      if (bVar2) {
        *puVar7 = 0;
        goto LAB_00812659;
      }
      goto LAB_00812df6;
    }
    pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
    if ((pPVar6->field_0x20 & 4) != 0) {
      auxSize = 0;
      local_44 = 0;
      bVar2 = Int32Math::Mul(argCount,8,&auxSize);
      if ((!bVar2) && (bVar2 = Int32Math::Add(8,auxSize,&local_44), !bVar2)) {
        pcVar11 = (char *)byteCodeGenerator->alloc;
        uVar17 = (ulong)auxSize;
        BVar3 = ExceptionCheck::CanHandleOutOfMemory();
        if (BVar3 == 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                             "ExceptionCheck::CanHandleOutOfMemory()");
          if (!bVar2) goto LAB_00812df6;
          *puVar7 = 0;
        }
        sVar10 = 0xffffffffffffffff;
        if (uVar17 < 0xfffffffffffffff8) {
          sVar10 = uVar17 + 8;
        }
        obj_00 = (AuxArray<double> *)
                 Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
                 AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *
                               )pcVar11,sVar10);
        if (obj_00 == (AuxArray<double> *)0x0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          pcVar11 = 
          "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
          ;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                             ,0x20d,"(buffer != nullptr)","buffer != nullptr");
          if (!bVar2) goto LAB_00812df6;
          *puVar7 = 0;
        }
        obj_00->count = argCount;
        EmitConstantArgsToFltArray
                  ((ByteCodeGenerator *)pcVar11,(double *)(obj_00 + 1),args,argCount);
        pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
        if ((pPVar6->field_0x20 & 8) != 0) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                             ,0x23bc,"(!pnode->AsParseNodeArrLit()->hasMissingValues)",
                             "!pnode->AsParseNodeArrLit()->hasMissingValues");
          if (!bVar2) goto LAB_00812df6;
          *puVar7 = 0;
        }
        Js::ByteCodeWriter::Auxiliary
                  (&byteCodeGenerator->m_writer,NewScFltArray,pnode->location,obj_00,local_44,
                   argCount);
        Memory::
        DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<double>>
                  (byteCodeGenerator->alloc,obj_00,(long)auxSize);
        return;
      }
      goto LAB_00812df1;
    }
  }
  pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
  if ((pPVar6->field_0x20 & 1) == 0) {
    uVar13 = 0;
  }
  else {
    pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
    bVar18 = 1 < pPVar6->count;
    uVar14 = (undefined7)((ulong)pnode >> 8);
    uVar13 = (undefined4)CONCAT71(uVar14,bVar18);
    if (bVar2 && bVar18) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                         ,0x23c8,"(!arrayLitOpt || !nativeArrays)","!arrayLitOpt || !nativeArrays");
      if (!bVar2) goto LAB_00812df6;
      *puVar7 = 0;
      uVar13 = (undefined4)CONCAT71(uVar14,1);
    }
  }
  if (0x3fffffff < uVar16) goto LAB_00812df1;
  uVar17 = (ulong)uVar16 * 4;
  pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
  local_40 = uVar13;
  if (pPVar6->spreadCount == 0) {
    local_68 = (AuxArray<unsigned_int> *)0x0;
    RVar15 = arrayLocation;
  }
  else {
    extraAlloc = FuncInfo::AcquireTmpRegister(funcInfo);
    this_00 = &byteCodeGenerator->alloc->
               super_ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>;
    BVar3 = ExceptionCheck::CanHandleOutOfMemory();
    if (BVar3 == 0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                         "ExceptionCheck::CanHandleOutOfMemory()");
      if (!bVar2) goto LAB_00812df6;
      *puVar7 = 0;
    }
    local_68 = (AuxArray<unsigned_int> *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal(this_00,uVar17 + 4);
    if (local_68 == (AuxArray<unsigned_int> *)0x0) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      *puVar7 = 1;
      bVar2 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                         ,0x20d,"(buffer != nullptr)","buffer != nullptr");
      if (!bVar2) goto LAB_00812df6;
      *puVar7 = 0;
    }
    local_68->count = uVar16;
    RVar15 = extraAlloc;
  }
  this = &byteCodeGenerator->m_writer;
  pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
  extraAlloc = RVar15;
  Js::ByteCodeWriter::Reg1Unsigned1
            (this,(ushort)((pPVar6->field_0x20 & 8) >> 3) * 2 + NewScArray,RVar15,argCount);
  if (args != (ParseNode *)0x0) {
    if ((argCount != 1) ||
       (bVar2 = Js::ByteCodeWriter::DoProfileNewScArrayOp(this,NewScArray), bVar2)) {
      if ((char)local_40 != '\0') {
        local_38 = FuncInfo::AcquireTmpRegister(funcInfo);
        Js::ByteCodeWriter::Reg2(this,LdArrHead,local_38,extraAlloc);
        if (0x1fffffff < argCount) goto LAB_00812df1;
        goto LAB_00812971;
      }
      bVar2 = Js::JavascriptArray::HasInlineHeadSegment(argCount);
      uVar13 = 0xa1;
      local_38 = extraAlloc;
      if (!bVar2) {
        uVar13 = 0x9e;
        if (argCount < 0x40001) {
          local_38 = FuncInfo::AcquireTmpRegister(funcInfo);
          Js::ByteCodeWriter::Reg2(this,LdArrHead,local_38,extraAlloc);
          uVar13 = 0xa2;
        }
      }
LAB_00812aa5:
      uVar16 = 0;
      puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
      local_6c = 0;
      local_40 = uVar13;
      while (args->nop == knopList) {
        pPVar8 = ParseNode::AsParseNodeBin(args);
        if (pPVar8->pnode1->nop != knopEmpty) {
          pPVar8 = ParseNode::AsParseNodeBin(args);
          Emit(pPVar8->pnode1,byteCodeGenerator,funcInfo,0,false,false);
          pPVar8 = ParseNode::AsParseNodeBin(args);
          RVar15 = pPVar8->pnode1->location;
          pPVar8 = ParseNode::AsParseNodeBin(args);
          RVar4 = RVar15;
          if (pPVar8->pnode1->nop == knopEllipsis) {
            if (local_68 == (AuxArray<unsigned_int> *)0x0) {
              AssertCount = AssertCount + 1;
              Js::Throw::LogAssert();
              *puVar7 = 1;
              bVar2 = Js::Throw::ReportAssert
                                ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                                 ,0x2414,"(spreadIndices)","spreadIndices");
              if (!bVar2) goto LAB_00812df6;
              *puVar7 = 0;
            }
            RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
            Js::ByteCodeWriter::Reg2(this,LdCustomSpreadIteratorList,RVar4,RVar15);
            uVar9 = (ulong)local_6c;
            local_6c = local_6c + 1;
            local_68[uVar9 + 1].count = uVar16;
          }
          Js::ByteCodeWriter::ElementUnsigned1(this,(OpCode)local_40,RVar4,local_38,uVar16);
          pPVar8 = ParseNode::AsParseNodeBin(args);
          if (pPVar8->pnode1->nop == knopEllipsis) {
            FuncInfo::ReleaseTmpRegister(funcInfo,RVar4);
          }
          pPVar8 = ParseNode::AsParseNodeBin(args);
          FuncInfo::ReleaseLoc(funcInfo,pPVar8->pnode1);
        }
        pPVar8 = ParseNode::AsParseNodeBin(args);
        uVar16 = uVar16 + 1;
        args = pPVar8->pnode2;
      }
      RVar15 = local_38;
      if (args->nop != knopEmpty) {
        Emit(args,byteCodeGenerator,funcInfo,0,false,false);
        RVar15 = args->location;
        RVar4 = RVar15;
        if (args->nop == knopEllipsis) {
          RVar4 = FuncInfo::AcquireTmpRegister(funcInfo);
          Js::ByteCodeWriter::Reg2(this,LdCustomSpreadIteratorList,RVar4,RVar15);
          if (local_68 == (AuxArray<unsigned_int> *)0x0) {
            AssertCount = AssertCount + 1;
            Js::Throw::LogAssert();
            *puVar7 = 1;
            bVar2 = Js::Throw::ReportAssert
                              ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                               ,0x2431,"(spreadIndices)","spreadIndices");
            if (!bVar2) goto LAB_00812df6;
            *puVar7 = 0;
          }
          local_68[(ulong)local_6c + 1].count = uVar16;
        }
        RVar15 = local_38;
        Js::ByteCodeWriter::ElementUnsigned1(this,(OpCode)local_40,RVar4,local_38,uVar16);
        if (args->nop == knopEllipsis) {
          FuncInfo::ReleaseTmpRegister(funcInfo,RVar4);
        }
        FuncInfo::ReleaseLoc(funcInfo,args);
        uVar16 = uVar16 + 1;
      }
      if (argCount < uVar16) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/ByteCode/ByteCodeEmitter.cpp"
                           ,0x243f,"(i <= argCount)","i <= argCount");
        if (!bVar2) {
LAB_00812df6:
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        *puVar7 = 0;
      }
    }
    else {
      uVar13 = 0x9f;
      local_38 = extraAlloc;
      if ((char)local_40 == '\0') goto LAB_00812aa5;
LAB_00812971:
      pcVar11 = (char *)byteCodeGenerator->alloc;
      BVar3 = ExceptionCheck::CanHandleOutOfMemory();
      if (BVar3 == 0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x207,"(ExceptionCheck::CanHandleOutOfMemory())",
                           "ExceptionCheck::CanHandleOutOfMemory()");
        if (!bVar2) goto LAB_00812df6;
        *puVar7 = 0;
      }
      sVar10 = (ulong)argCount * 8;
      obj_01 = (AuxArray<void_*> *)
               Memory::ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL>::
               AllocInternal((ArenaAllocatorBase<Memory::InPlaceFreeListPolicy,_4UL,_false,_0UL> *)
                             pcVar11,sVar10 + 8);
      if (obj_01 == (AuxArray<void_*> *)0x0) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar7 = (undefined4 *)__tls_get_addr(&PTR_01548f08);
        *puVar7 = 1;
        pcVar11 = 
        "/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
        ;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/Allocator.h"
                           ,0x20d,"(buffer != nullptr)","buffer != nullptr");
        if (!bVar2) goto LAB_00812df6;
        *puVar7 = 0;
      }
      obj_01->count = argCount;
      EmitConstantArgsToVarArray((ByteCodeGenerator *)pcVar11,(Var *)(obj_01 + 1),args,argCount);
      RVar15 = local_38;
      iVar12 = (int)sVar10 + 8;
      if (iVar12 == 0) goto LAB_00812df1;
      Js::ByteCodeWriter::Auxiliary(this,StArrSegItem_A,local_38,obj_01,iVar12,argCount);
      Memory::
      DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<void*>>
                (byteCodeGenerator->alloc,obj_01,sVar10);
    }
    if (RVar15 != extraAlloc) {
      FuncInfo::ReleaseTmpRegister(funcInfo,RVar15);
    }
  }
  pPVar6 = ParseNode::AsParseNodeArrLit(pnode);
  iVar12 = extraAlloc;
  if (pPVar6->spreadCount == 0) {
    return;
  }
  byteCount = (int)uVar17 + 4;
  if (byteCount != 0) {
    Js::ByteCodeWriter::Reg2Aux
              (this,SpreadArrayLiteral,arrayLocation,extraAlloc,local_68,byteCount,(int)uVar17);
    Memory::
    DeleteObject<Memory::ArenaAllocator,(Memory::AllocatorDeleteFlags)0,Js::AuxArray<unsigned_int>>
              (byteCodeGenerator->alloc,local_68,uVar17 & 0xffffffff);
    FuncInfo::ReleaseTmpRegister(funcInfo,iVar12);
    return;
  }
LAB_00812df1:
  Math::DefaultOverflowPolicy();
}

Assistant:

void SetNewArrayElements(ParseNode *pnode, Js::RegSlot arrayLocation, ByteCodeGenerator *byteCodeGenerator, FuncInfo *funcInfo)
{
    ParseNode *args = pnode->AsParseNodeUni()->pnode1;
    uint argCount = pnode->AsParseNodeArrLit()->count;
    uint spreadCount = pnode->AsParseNodeArrLit()->spreadCount;
    bool nativeArrays = CreateNativeArrays(byteCodeGenerator, funcInfo);

    bool arrayIntOpt = nativeArrays && pnode->AsParseNodeArrLit()->arrayOfInts;
    if (arrayIntOpt)
    {
        int extraAlloc = 0, auxSize = 0;
        if (Int32Math::Mul(argCount, sizeof(int32), &extraAlloc)
            || Int32Math::Add(sizeof(Js::AuxArray<int>), extraAlloc, &auxSize))
        {
            ::Math::DefaultOverflowPolicy();
        }
        Js::AuxArray<int> *ints = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<int32>, argCount);
        EmitConstantArgsToIntArray(byteCodeGenerator, ints->elements, args, argCount);
        Assert(!pnode->AsParseNodeArrLit()->hasMissingValues);
        byteCodeGenerator->Writer()->Auxiliary(
            Js::OpCode::NewScIntArray,
            pnode->location,
            ints,
            auxSize,
            argCount);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, ints);
        return;
    }

    bool arrayNumOpt = nativeArrays && pnode->AsParseNodeArrLit()->arrayOfNumbers;
    if (arrayNumOpt)
    {
        int extraAlloc = 0, auxSize = 0;
        if (Int32Math::Mul(argCount, sizeof(double), &extraAlloc)
            || Int32Math::Add(sizeof(Js::AuxArray<double>), extraAlloc, &auxSize))
        {
            ::Math::DefaultOverflowPolicy();
        }
        Js::AuxArray<double> *doubles = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<double>, argCount);
        EmitConstantArgsToFltArray(byteCodeGenerator, doubles->elements, args, argCount);
        Assert(!pnode->AsParseNodeArrLit()->hasMissingValues);
        byteCodeGenerator->Writer()->Auxiliary(
            Js::OpCode::NewScFltArray,
            pnode->location,
            doubles,
            auxSize,
            argCount);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, doubles);
        return;
    }

    bool arrayLitOpt = pnode->AsParseNodeArrLit()->arrayOfTaggedInts && pnode->AsParseNodeArrLit()->count > 1;
    Assert(!arrayLitOpt || !nativeArrays);

    Js::RegSlot spreadArrLoc = arrayLocation;
    Js::AuxArray<uint32> *spreadIndices = nullptr;
    const uint extraAlloc = UInt32Math::Mul(spreadCount, sizeof(uint32));
    if (pnode->AsParseNodeArrLit()->spreadCount > 0)
    {
        arrayLocation = funcInfo->AcquireTmpRegister();
        spreadIndices = AnewPlus(byteCodeGenerator->GetAllocator(), extraAlloc, Js::AuxArray<uint32>, spreadCount);
    }

    byteCodeGenerator->Writer()->Reg1Unsigned1(
        pnode->AsParseNodeArrLit()->hasMissingValues ? Js::OpCode::NewScArrayWithMissingValues : Js::OpCode::NewScArray,
        arrayLocation,
        argCount);

    if (args != nullptr)
    {
        Js::OpCode opcode;
        Js::RegSlot arrLoc;
        if (argCount == 1 && !byteCodeGenerator->Writer()->DoProfileNewScArrayOp(Js::OpCode::NewScArray))
        {
            opcode = Js::OpCode::StArrItemC_CI4;
            arrLoc = arrayLocation;
        }
        else if (arrayLitOpt)
        {
            opcode = Js::OpCode::StArrSegItem_A;
            arrLoc = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdArrHead, arrLoc, arrayLocation);
        }
        else if (Js::JavascriptArray::HasInlineHeadSegment(argCount))
        {
            // The head segment will be allocated inline as an interior pointer. To keep the array alive, the set operation
            // should be done relative to the array header to keep it alive (instead of the array segment).
            opcode = Js::OpCode::StArrInlineItem_CI4;
            arrLoc = arrayLocation;
        }
        else if (argCount <= Js::JavascriptArray::MaxInitialDenseLength)
        {
            opcode = Js::OpCode::StArrSegItem_CI4;
            arrLoc = funcInfo->AcquireTmpRegister();
            byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdArrHead, arrLoc, arrayLocation);
        }
        else
        {
            opcode = Js::OpCode::StArrItemI_CI4;
            arrLoc = arrayLocation;
        }

        if (arrayLitOpt)
        {
            uint32 allocSize = UInt32Math::Mul(argCount, sizeof(Js::Var));
            Js::VarArray *vars = AnewPlus(byteCodeGenerator->GetAllocator(), allocSize, Js::VarArray, argCount);

            EmitConstantArgsToVarArray(byteCodeGenerator, vars->elements, args, argCount);

            // Generate the opcode with vars
            byteCodeGenerator->Writer()->Auxiliary(Js::OpCode::StArrSegItem_A, arrLoc, vars, UInt32Math::Add(sizeof(Js::VarArray), allocSize), argCount);

            AdeletePlus(byteCodeGenerator->GetAllocator(), allocSize, vars);
        }
        else
        {
            uint i = 0;
            unsigned spreadIndex = 0;
            Js::RegSlot rhsLocation;
            while (args->nop == knopList)
            {
                if (args->AsParseNodeBin()->pnode1->nop != knopEmpty)
                {
                    Emit(args->AsParseNodeBin()->pnode1, byteCodeGenerator, funcInfo, false);
                    rhsLocation = args->AsParseNodeBin()->pnode1->location;
                    Js::RegSlot regVal = rhsLocation;
                    if (args->AsParseNodeBin()->pnode1->nop == knopEllipsis)
                    {
                        AnalysisAssert(spreadIndices);
                        regVal = funcInfo->AcquireTmpRegister();
                        byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdCustomSpreadIteratorList, regVal, rhsLocation);
                        spreadIndices->elements[spreadIndex++] = i;
                    }

                    byteCodeGenerator->Writer()->ElementUnsigned1(opcode, regVal, arrLoc, i);

                    if (args->AsParseNodeBin()->pnode1->nop == knopEllipsis)
                    {
                        funcInfo->ReleaseTmpRegister(regVal);
                    }

                    funcInfo->ReleaseLoc(args->AsParseNodeBin()->pnode1);
                }

                args = args->AsParseNodeBin()->pnode2;
                i++;
            }

            if (args->nop != knopEmpty)
            {
                Emit(args, byteCodeGenerator, funcInfo, false);
                rhsLocation = args->location;
                Js::RegSlot regVal = rhsLocation;
                if (args->nop == knopEllipsis)
                {
                    regVal = funcInfo->AcquireTmpRegister();
                    byteCodeGenerator->Writer()->Reg2(Js::OpCode::LdCustomSpreadIteratorList, regVal, rhsLocation);
                    AnalysisAssert(spreadIndices);
                    spreadIndices->elements[spreadIndex] = i;
                }

                byteCodeGenerator->Writer()->ElementUnsigned1(opcode, regVal, arrLoc, i);

                if (args->nop == knopEllipsis)
                {
                    funcInfo->ReleaseTmpRegister(regVal);
                }

                funcInfo->ReleaseLoc(args);
                i++;
            }
            Assert(i <= argCount);
        }

        if (arrLoc != arrayLocation)
        {
            funcInfo->ReleaseTmpRegister(arrLoc);
        }
    }

    if (pnode->AsParseNodeArrLit()->spreadCount > 0)
    {
        byteCodeGenerator->Writer()->Reg2Aux(Js::OpCode::SpreadArrayLiteral, spreadArrLoc, arrayLocation, spreadIndices, UInt32Math::Add(sizeof(Js::AuxArray<uint32>), extraAlloc), extraAlloc);
        AdeletePlus(byteCodeGenerator->GetAllocator(), extraAlloc, spreadIndices);
        funcInfo->ReleaseTmpRegister(arrayLocation);
    }
}